

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

void inverse_mdct(float *buffer,int n,vorb *f,int blocktype)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float *pfVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  float *pfVar12;
  int lim_00;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  float *local_180;
  float p3;
  float p2;
  float p1;
  float p0;
  float *e_2;
  float *B;
  float *d3;
  float *d2;
  float *d1_2;
  float *d0_2;
  float b3;
  float b2;
  float b1;
  float b0;
  float a11;
  float a02;
  float *e_1;
  float *d_1;
  float *C;
  SDL_AssertState sdl_assert_state;
  int k4;
  float *d1_1;
  float *d0_1;
  uint16 *bitrev;
  float *A0;
  int i_off;
  int lim_1;
  int r;
  int rlim;
  int k0_2_1;
  int k1;
  int k0_1;
  int i;
  int lim;
  int k0_2;
  int k0;
  float v41_21;
  float v40_20;
  float *e1;
  float *e0;
  float *d1;
  float *d0;
  float *AA_1;
  float *e_stop;
  float *AA;
  float *e;
  float *d;
  float *A;
  float *v;
  float *u;
  float *buf2;
  int save_point;
  int ld;
  int l;
  int n8;
  int n4;
  int n2;
  int blocktype_local;
  vorb *f_local;
  int n_local;
  float *buffer_local;
  
  pfVar12 = (float *)&stack0xfffffffffffffe78;
  iVar6 = n >> 1;
  iVar7 = n >> 2;
  iVar8 = n >> 3;
  iVar3 = f->temp_offset;
  if ((f->alloc).alloc_buffer == (char *)0x0) {
    pfVar12 = (float *)(&stack0xfffffffffffffe78 + -((long)iVar6 * 4 + 0xfU & 0xfffffffffffffff0));
    local_180 = pfVar12;
  }
  else {
    local_180 = (float *)setup_temp_malloc((vorb *)CONCAT44(in_stack_fffffffffffffe7c,
                                                            in_stack_fffffffffffffe78),0);
  }
  pfVar4 = f->A[blocktype];
  e = local_180 + (iVar6 + -2);
  e_stop = pfVar4;
  for (AA = buffer; AA != buffer + iVar6; AA = AA + 4) {
    e[1] = *AA * *e_stop + -(AA[2] * e_stop[1]);
    *e = *AA * e_stop[1] + AA[2] * *e_stop;
    e = e + -2;
    e_stop = e_stop + 2;
  }
  AA = buffer + (iVar6 + -3);
  for (; local_180 <= e; e = e + -2) {
    e[1] = -AA[2] * *e_stop + -(-*AA * e_stop[1]);
    *e = -AA[2] * e_stop[1] + -*AA * *e_stop;
    e_stop = e_stop + 2;
    AA = AA + -4;
  }
  e1 = local_180 + iVar7;
  _v41_21 = local_180;
  d1 = buffer + iVar7;
  e0 = buffer;
  for (d0 = pfVar4 + (iVar6 + -8); pfVar4 <= d0; d0 = d0 + -8) {
    fVar15 = e1[1];
    fVar16 = _v41_21[1];
    fVar1 = *e1;
    fVar2 = *_v41_21;
    d1[1] = e1[1] + _v41_21[1];
    *d1 = *e1 + *_v41_21;
    e0[1] = (fVar15 - fVar16) * d0[4] + -((fVar1 - fVar2) * d0[5]);
    *e0 = (fVar1 - fVar2) * d0[4] + (fVar15 - fVar16) * d0[5];
    fVar15 = e1[3];
    fVar16 = _v41_21[3];
    fVar1 = e1[2];
    fVar2 = _v41_21[2];
    d1[3] = e1[3] + _v41_21[3];
    d1[2] = e1[2] + _v41_21[2];
    e0[3] = (fVar15 - fVar16) * *d0 + -((fVar1 - fVar2) * d0[1]);
    e0[2] = (fVar1 - fVar2) * *d0 + (fVar15 - fVar16) * d0[1];
    d1 = d1 + 4;
    e0 = e0 + 4;
    e1 = e1 + 4;
    _v41_21 = _v41_21 + 4;
  }
  pfVar12[-2] = 1.843488e-39;
  pfVar12[-1] = 0.0;
  iVar9 = ilog(n);
  pfVar12[-2] = 1.843554e-39;
  pfVar12[-1] = 0.0;
  imdct_step3_iter0_loop
            ((int)pfVar12[0xf],*(float **)(pfVar12 + 0xc),(int)pfVar12[0xb],(int)pfVar12[10],
             *(float **)(pfVar12 + 8));
  pfVar12[-2] = 1.843614e-39;
  pfVar12[-1] = 0.0;
  imdct_step3_iter0_loop
            ((int)pfVar12[0xf],*(float **)(pfVar12 + 0xc),(int)pfVar12[0xb],(int)pfVar12[10],
             *(float **)(pfVar12 + 8));
  lim_00 = n >> 5;
  iVar10 = n >> 4;
  pfVar12[-2] = 1.84368e-39;
  pfVar12[-1] = 0.0;
  imdct_step3_inner_r_loop(lim_00,buffer,iVar6 + -1,-iVar10,pfVar4,0x10);
  pfVar12[-2] = 1.843749e-39;
  pfVar12[-1] = 0.0;
  imdct_step3_inner_r_loop(lim_00,buffer,(iVar6 + -1) - iVar8,-iVar10,pfVar4,0x10);
  pfVar12[-2] = 1.843816e-39;
  pfVar12[-1] = 0.0;
  imdct_step3_inner_r_loop(lim_00,buffer,iVar6 + -1 + iVar8 * -2,-iVar10,pfVar4,0x10);
  pfVar12[-2] = 1.843882e-39;
  pfVar12[-1] = 0.0;
  imdct_step3_inner_r_loop(lim_00,buffer,iVar6 + -1 + iVar8 * -3,-iVar10,pfVar4,0x10);
  for (save_point = 2; save_point < iVar9 + -4 >> 1; save_point = save_point + 1) {
    cVar5 = (char)save_point;
    iVar8 = n >> (cVar5 + 2U & 0x1f);
    for (k1 = 0; k1 < 1 << (cVar5 + 1U & 0x1f); k1 = k1 + 1) {
      pfVar12[-2] = 1.844134e-39;
      pfVar12[-1] = 0.0;
      imdct_step3_inner_r_loop
                (n >> (cVar5 + 4U & 0x1f),buffer,(iVar6 + -1) - iVar8 * k1,-(iVar8 >> 1),pfVar4,
                 1 << (cVar5 + 3U & 0x1f));
    }
  }
  for (; save_point < iVar9 + -7; save_point = save_point + 1) {
    cVar5 = (char)save_point;
    iVar8 = n >> (cVar5 + 2U & 0x1f);
    iVar10 = 1 << (cVar5 + 3U & 0x1f);
    A0._4_4_ = iVar6 + -1;
    bitrev = (uint16 *)pfVar4;
    for (i_off = n >> (cVar5 + 6U & 0x1f); 0 < i_off; i_off = i_off + -1) {
      pfVar12[-4] = (float)iVar8;
      pfVar12[-6] = 1.844473e-39;
      pfVar12[-5] = 0.0;
      imdct_step3_inner_s_loop
                (1 << (cVar5 + 1U & 0x1f),buffer,A0._4_4_,-(iVar8 >> 1),(float *)bitrev,iVar10,
                 (int)pfVar12[-4]);
      bitrev = bitrev + (long)(iVar10 << 2) * 2;
      A0._4_4_ = A0._4_4_ + -8;
    }
  }
  pfVar12[-2] = 1.844637e-39;
  pfVar12[-1] = 0.0;
  imdct_step3_inner_s_loop_ld654
            ((int)pfVar12[0xf],*(float **)(pfVar12 + 0xc),(int)pfVar12[0xb],*(float **)(pfVar12 + 8)
             ,(int)pfVar12[7]);
  d0_1 = (float *)f->bit_reverse[blocktype];
  _sdl_assert_state = local_180 + (iVar6 + -4);
  for (d1_1 = local_180 + (iVar7 + -4); local_180 <= d1_1; d1_1 = d1_1 + -4) {
    uVar11 = (uint)*(ushort *)d0_1;
    _sdl_assert_state[3] = buffer[(int)uVar11];
    _sdl_assert_state[2] = buffer[(int)(uVar11 + 1)];
    d1_1[3] = buffer[(int)(uVar11 + 2)];
    d1_1[2] = buffer[(int)(uVar11 + 3)];
    uVar11 = (uint)*(ushort *)((long)d0_1 + 2);
    _sdl_assert_state[1] = buffer[(int)uVar11];
    *_sdl_assert_state = buffer[(int)(uVar11 + 1)];
    d1_1[1] = buffer[(int)(uVar11 + 2)];
    *d1_1 = buffer[(int)(uVar11 + 3)];
    _sdl_assert_state = _sdl_assert_state + -4;
    d0_1 = d0_1 + 1;
  }
  d_1 = f->C[blocktype];
  pfVar12 = local_180 + iVar6;
  for (e_1 = local_180; _a11 = pfVar12 + -4, e_1 < _a11; e_1 = e_1 + 4) {
    fVar13 = d_1[1] * (*e_1 - pfVar12[-2]) + *d_1 * (e_1[1] + pfVar12[-1]);
    fVar14 = d_1[1] * (e_1[1] + pfVar12[-1]) + -(*d_1 * (*e_1 - pfVar12[-2]));
    fVar15 = *e_1;
    fVar16 = pfVar12[-2];
    fVar1 = e_1[1];
    fVar2 = pfVar12[-1];
    *e_1 = fVar15 + fVar16 + fVar13;
    e_1[1] = (fVar1 - fVar2) + fVar14;
    pfVar12[-2] = (fVar15 + fVar16) - fVar13;
    pfVar12[-1] = fVar14 - (fVar1 - fVar2);
    fVar13 = d_1[3] * (e_1[2] - *_a11) + d_1[2] * (e_1[3] + pfVar12[-3]);
    fVar14 = d_1[3] * (e_1[3] + pfVar12[-3]) + -(d_1[2] * (e_1[2] - *_a11));
    fVar15 = e_1[2];
    fVar16 = *_a11;
    fVar1 = e_1[3];
    fVar2 = pfVar12[-3];
    e_1[2] = fVar15 + fVar16 + fVar13;
    e_1[3] = (fVar1 - fVar2) + fVar14;
    *_a11 = (fVar15 + fVar16) - fVar13;
    pfVar12[-3] = fVar14 - (fVar1 - fVar2);
    d_1 = d_1 + 4;
    pfVar12 = _a11;
  }
  d2 = buffer + (iVar6 + -4);
  d3 = buffer + iVar6;
  B = buffer + (n + -4);
  d1_2 = buffer;
  pfVar12 = local_180 + iVar6;
  pfVar4 = f->B[blocktype] + iVar6;
  while( true ) {
    e_2 = pfVar4 + -8;
    _p1 = pfVar12 + -8;
    if (_p1 < local_180) break;
    fVar15 = pfVar12[-2] * pfVar4[-1] + -(pfVar12[-1] * pfVar4[-2]);
    fVar16 = -pfVar12[-2] * pfVar4[-2] + -(pfVar12[-1] * pfVar4[-1]);
    *d1_2 = fVar15;
    d2[3] = -fVar15;
    *d3 = fVar16;
    B[3] = fVar16;
    fVar15 = pfVar12[-4] * pfVar4[-3] + -(pfVar12[-3] * pfVar4[-4]);
    fVar16 = -pfVar12[-4] * pfVar4[-4] + -(pfVar12[-3] * pfVar4[-3]);
    d1_2[1] = fVar15;
    d2[2] = -fVar15;
    d3[1] = fVar16;
    B[2] = fVar16;
    fVar15 = pfVar12[-6] * pfVar4[-5] + -(pfVar12[-5] * pfVar4[-6]);
    fVar16 = -pfVar12[-6] * pfVar4[-6] + -(pfVar12[-5] * pfVar4[-5]);
    d1_2[2] = fVar15;
    d2[1] = -fVar15;
    d3[2] = fVar16;
    B[1] = fVar16;
    fVar15 = *_p1 * pfVar4[-7] + -(pfVar12[-7] * *e_2);
    fVar16 = -*_p1 * *e_2 + -(pfVar12[-7] * pfVar4[-7]);
    d1_2[3] = fVar15;
    *d2 = -fVar15;
    d3[3] = fVar16;
    *B = fVar16;
    d1_2 = d1_2 + 4;
    d3 = d3 + 4;
    d2 = d2 + -4;
    B = B + -4;
    pfVar12 = _p1;
    pfVar4 = e_2;
  }
  f->temp_offset = iVar3;
  return;
}

Assistant:

static void inverse_mdct(float *buffer, int n, vorb *f, int blocktype)
{
   int n2 = n >> 1, n4 = n >> 2, n8 = n >> 3, l;
   int ld;
   // @OPTIMIZE: reduce register pressure by using fewer variables?
   int save_point = temp_alloc_save(f);
   float *buf2 = (float *) temp_alloc(f, n2 * sizeof(*buf2));
   float *u=NULL,*v=NULL;
   // twiddle factors
   float *A = f->A[blocktype];

   // IMDCT algorithm from "The use of multirate filter banks for coding of high quality digital audio"
   // See notes about bugs in that paper in less-optimal implementation 'inverse_mdct_old' after this function.

   // kernel from paper


   // merged:
   //   copy and reflect spectral data
   //   step 0

   // note that it turns out that the items added together during
   // this step are, in fact, being added to themselves (as reflected
   // by step 0). inexplicable inefficiency! this became obvious
   // once I combined the passes.

   // so there's a missing 'times 2' here (for adding X to itself).
   // this propagates through linearly to the end, where the numbers
   // are 1/2 too small, and need to be compensated for.

   {
      float *d,*e, *AA, *e_stop;
      d = &buf2[n2-2];
      AA = A;
      e = &buffer[0];
      e_stop = &buffer[n2];
      while (e != e_stop) {
         d[1] = (e[0] * AA[0] - e[2]*AA[1]);
         d[0] = (e[0] * AA[1] + e[2]*AA[0]);
         d -= 2;
         AA += 2;
         e += 4;
      }

      e = &buffer[n2-3];
      while (d >= buf2) {
         d[1] = (-e[2] * AA[0] - -e[0]*AA[1]);
         d[0] = (-e[2] * AA[1] + -e[0]*AA[0]);
         d -= 2;
         AA += 2;
         e -= 4;
      }
   }

   // now we use symbolic names for these, so that we can
   // possibly swap their meaning as we change which operations
   // are in place

   u = buffer;
   v = buf2;

   // step 2    (paper output is w, now u)
   // this could be in place, but the data ends up in the wrong
   // place... _somebody_'s got to swap it, so this is nominated
   {
      float *AA = &A[n2-8];
      float *d0,*d1, *e0, *e1;

      e0 = &v[n4];
      e1 = &v[0];

      d0 = &u[n4];
      d1 = &u[0];

      while (AA >= A) {
         float v40_20, v41_21;

         v41_21 = e0[1] - e1[1];
         v40_20 = e0[0] - e1[0];
         d0[1]  = e0[1] + e1[1];
         d0[0]  = e0[0] + e1[0];
         d1[1]  = v41_21*AA[4] - v40_20*AA[5];
         d1[0]  = v40_20*AA[4] + v41_21*AA[5];

         v41_21 = e0[3] - e1[3];
         v40_20 = e0[2] - e1[2];
         d0[3]  = e0[3] + e1[3];
         d0[2]  = e0[2] + e1[2];
         d1[3]  = v41_21*AA[0] - v40_20*AA[1];
         d1[2]  = v40_20*AA[0] + v41_21*AA[1];

         AA -= 8;

         d0 += 4;
         d1 += 4;
         e0 += 4;
         e1 += 4;
      }
   }

   // step 3
   ld = ilog(n) - 1; // ilog is off-by-one from normal definitions

   // optimized step 3:

   // the original step3 loop can be nested r inside s or s inside r;
   // it's written originally as s inside r, but this is dumb when r
   // iterates many times, and s few. So I have two copies of it and
   // switch between them halfway.

   // this is iteration 0 of step 3
   imdct_step3_iter0_loop(n >> 4, u, n2-1-n4*0, -(n >> 3), A);
   imdct_step3_iter0_loop(n >> 4, u, n2-1-n4*1, -(n >> 3), A);

   // this is iteration 1 of step 3
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*0, -(n >> 4), A, 16);
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*1, -(n >> 4), A, 16);
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*2, -(n >> 4), A, 16);
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*3, -(n >> 4), A, 16);

   l=2;
   for (; l < (ld-3)>>1; ++l) {
      int k0 = n >> (l+2), k0_2 = k0>>1;
      int lim = 1 << (l+1);
      int i;
      for (i=0; i < lim; ++i)
         imdct_step3_inner_r_loop(n >> (l+4), u, n2-1 - k0*i, -k0_2, A, 1 << (l+3));
   }

   for (; l < ld-6; ++l) {
      int k0 = n >> (l+2), k1 = 1 << (l+3), k0_2 = k0>>1;
      int rlim = n >> (l+6), r;
      int lim = 1 << (l+1);
      int i_off;
      float *A0 = A;
      i_off = n2-1;
      for (r=rlim; r > 0; --r) {
         imdct_step3_inner_s_loop(lim, u, i_off, -k0_2, A0, k1, k0);
         A0 += k1*4;
         i_off -= 8;
      }
   }

   // iterations with count:
   //   ld-6,-5,-4 all interleaved together
   //       the big win comes from getting rid of needless flops
   //         due to the constants on pass 5 & 4 being all 1 and 0;
   //       combining them to be simultaneous to improve cache made little difference
   imdct_step3_inner_s_loop_ld654(n >> 5, u, n2-1, A, n);

   // output is u

   // step 4, 5, and 6
   // cannot be in-place because of step 5
   {
      uint16 *bitrev = f->bit_reverse[blocktype];
      // weirdly, I'd have thought reading sequentially and writing
      // erratically would have been better than vice-versa, but in
      // fact that's not what my testing showed. (That is, with
      // j = bitreverse(i), do you read i and write j, or read j and write i.)

      float *d0 = &v[n4-4];
      float *d1 = &v[n2-4];
      while (d0 >= v) {
         int k4;

         k4 = bitrev[0];
         d1[3] = u[k4+0];
         d1[2] = u[k4+1];
         d0[3] = u[k4+2];
         d0[2] = u[k4+3];

         k4 = bitrev[1];
         d1[1] = u[k4+0];
         d1[0] = u[k4+1];
         d0[1] = u[k4+2];
         d0[0] = u[k4+3];

         d0 -= 4;
         d1 -= 4;
         bitrev += 2;
      }
   }
   // (paper output is u, now v)


   // data must be in buf2
   assert(v == buf2);

   // step 7   (paper output is v, now v)
   // this is now in place
   {
      float *C = f->C[blocktype];
      float *d, *e;

      d = v;
      e = v + n2 - 4;

      while (d < e) {
         float a02,a11,b0,b1,b2,b3;

         a02 = d[0] - e[2];
         a11 = d[1] + e[3];

         b0 = C[1]*a02 + C[0]*a11;
         b1 = C[1]*a11 - C[0]*a02;

         b2 = d[0] + e[ 2];
         b3 = d[1] - e[ 3];

         d[0] = b2 + b0;
         d[1] = b3 + b1;
         e[2] = b2 - b0;
         e[3] = b1 - b3;

         a02 = d[2] - e[0];
         a11 = d[3] + e[1];

         b0 = C[3]*a02 + C[2]*a11;
         b1 = C[3]*a11 - C[2]*a02;

         b2 = d[2] + e[ 0];
         b3 = d[3] - e[ 1];

         d[2] = b2 + b0;
         d[3] = b3 + b1;
         e[0] = b2 - b0;
         e[1] = b1 - b3;

         C += 4;
         d += 4;
         e -= 4;
      }
   }

   // data must be in buf2


   // step 8+decode   (paper output is X, now buffer)
   // this generates pairs of data a la 8 and pushes them directly through
   // the decode kernel (pushing rather than pulling) to avoid having
   // to make another pass later

   // this cannot POSSIBLY be in place, so we refer to the buffers directly

   {
      float *d0,*d1,*d2,*d3;

      float *B = f->B[blocktype] + n2 - 8;
      float *e = buf2 + n2 - 8;
      d0 = &buffer[0];
      d1 = &buffer[n2-4];
      d2 = &buffer[n2];
      d3 = &buffer[n-4];
      while (e >= v) {
         float p0,p1,p2,p3;

         p3 =  e[6]*B[7] - e[7]*B[6];
         p2 = -e[6]*B[6] - e[7]*B[7];

         d0[0] =   p3;
         d1[3] = - p3;
         d2[0] =   p2;
         d3[3] =   p2;

         p1 =  e[4]*B[5] - e[5]*B[4];
         p0 = -e[4]*B[4] - e[5]*B[5];

         d0[1] =   p1;
         d1[2] = - p1;
         d2[1] =   p0;
         d3[2] =   p0;

         p3 =  e[2]*B[3] - e[3]*B[2];
         p2 = -e[2]*B[2] - e[3]*B[3];

         d0[2] =   p3;
         d1[1] = - p3;
         d2[2] =   p2;
         d3[1] =   p2;

         p1 =  e[0]*B[1] - e[1]*B[0];
         p0 = -e[0]*B[0] - e[1]*B[1];

         d0[3] =   p1;
         d1[0] = - p1;
         d2[3] =   p0;
         d3[0] =   p0;

         B -= 8;
         e -= 8;
         d0 += 4;
         d2 += 4;
         d1 -= 4;
         d3 -= 4;
      }
   }

   temp_free(f,buf2);
   temp_alloc_restore(f,save_point);
}